

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O0

string * __thiscall
jbcoin::STObject::getText_abi_cxx11_(string *__return_storage_ptr__,STObject *this)

{
  bool bVar1;
  STBase *pSVar2;
  string local_70 [32];
  STVar *local_50;
  STVar *elem;
  const_iterator __end1;
  const_iterator __begin1;
  list_type *__range1;
  bool first;
  allocator local_1a;
  undefined1 local_19;
  STObject *local_18;
  STObject *this_local;
  string *ret;
  
  local_19 = 0;
  local_18 = this;
  this_local = (STObject *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"{",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  __end1 = std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>::begin
                     (&this->v_);
  elem = (STVar *)std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>::end
                            (&this->v_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_jbcoin::detail::STVar_*,_std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>_>
                                     *)&elem), bVar1) {
    local_50 = __gnu_cxx::
               __normal_iterator<const_jbcoin::detail::STVar_*,_std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>_>
               ::operator*(&__end1);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
    pSVar2 = jbcoin::detail::STVar::operator->(local_50);
    (*pSVar2->_vptr_STBase[6])(local_70);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_70);
    std::__cxx11::string::~string(local_70);
    __gnu_cxx::
    __normal_iterator<const_jbcoin::detail::STVar_*,_std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"}");
  return __return_storage_ptr__;
}

Assistant:

std::string STObject::getText () const
{
    std::string ret = "{";
    bool first = false;
    for (auto const& elem : v_)
    {
        if (! first)
        {
            ret += ", ";
            first = false;
        }

        ret += elem->getText ();
    }
    ret += "}";
    return ret;
}